

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O3

void __thiscall TxIndex::DB::DB(DB *this,size_t n_cache_size,bool f_memory,bool f_wipe)

{
  long in_FS_OFFSET;
  path pStack_a8;
  path local_80;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir((path *)&pStack_a8,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&pStack_a8,7,"indexes");
  std::filesystem::__cxx11::path::path(&local_80,&pStack_a8);
  std::filesystem::__cxx11::path::_M_append(&local_80,7,"txindex");
  std::filesystem::__cxx11::path::path(&local_58,&local_80);
  BaseIndex::DB::DB(&this->super_DB,(path *)&local_58,n_cache_size,f_memory,f_wipe,false);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::__cxx11::path::~path(&pStack_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TxIndex::DB::DB(size_t n_cache_size, bool f_memory, bool f_wipe) :
    BaseIndex::DB(gArgs.GetDataDirNet() / "indexes" / "txindex", n_cache_size, f_memory, f_wipe)
{}